

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

void __thiscall UnionType::UnionType(UnionType *this,string *name)

{
  AggregateType::AggregateType(&this->super_AggregateType,TK_UnionType,name);
  (this->super_AggregateType).super_Type._vptr_Type = (_func_int **)&PTR__AggregateType_00198850;
  return;
}

Assistant:

UnionType::UnionType(const std::string& name) : AggregateType(TK_UnionType, name) {}